

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t container_get_element_count(container_t *c,uint8_t typecode)

{
  uint8_t typecode_local;
  container_t *c_local;
  undefined4 local_4;
  
  if (typecode == '\x01') {
    local_4 = *c;
  }
  else if (typecode == '\x02') {
    local_4 = *c;
  }
  else {
    local_4 = *c;
  }
  return local_4;
}

Assistant:

static inline uint32_t container_get_element_count(const container_t *c,
                                                   uint8_t typecode) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            return ((bitset_container_t *)c)->cardinality;
        }
        case ARRAY_CONTAINER_TYPE: {
            return ((array_container_t *)c)->cardinality;
        }
        case RUN_CONTAINER_TYPE: {
            return ((run_container_t *)c)->n_runs;
        }
        default: {
            assert(false);
            roaring_unreachable;
            return 0;
        }
    }
}